

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86::forward_int8_x86
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  ulong uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined4 uVar17;
  int *piVar18;
  undefined4 uVar23;
  _func_int **pp_Var19;
  void *pvVar20;
  size_t sVar21;
  Layer *pLVar22;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined8 uVar32;
  undefined1 auVar39 [14];
  undefined1 auVar40 [12];
  unkbyte10 Var41;
  undefined1 auVar42 [12];
  Mat *pMVar43;
  int iVar44;
  long lVar45;
  byte bVar46;
  int iVar47;
  _func_int *p_Var48;
  long lVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  undefined1 auVar61 [16];
  short sVar75;
  short sVar79;
  int iVar76;
  short sVar80;
  Option opt_unpack;
  Option opt_flatten;
  Mat local_168;
  Mat *local_120;
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  int iStack_e0;
  undefined4 uStack_dc;
  size_t local_d8;
  Mat local_c8;
  undefined1 local_78 [32];
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  undefined1 auStack_48 [12];
  size_t local_38;
  undefined7 uVar5;
  undefined6 uVar7;
  undefined5 uVar9;
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined3 uVar35;
  undefined1 uVar36;
  undefined2 uVar37;
  undefined1 uVar38;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar77 [12];
  undefined1 auVar78 [16];
  
  iVar47 = *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x30 + (long)&(this->weight_data_int8).data)
           / *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x28 + (long)&(this->weight_data_int8).data
                     );
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  if ((local_168.dims == 2) && (local_168.w == iVar47)) {
    local_168.elempack = bottom_blob->elempack;
    if (1 < bottom_blob->h * local_168.elempack) {
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      local_118._0_8_ = *(undefined8 *)opt;
      local_118._16_8_ = opt->workspace_allocator;
      local_118._24_4_ = opt->openmp_blocktime;
      local_118[0x1c] = opt->use_winograd_convolution;
      local_118[0x1d] = opt->use_sgemm_convolution;
      local_118[0x1e] = opt->use_int8_inference;
      local_118[0x1f] = opt->use_vulkan_compute;
      local_f8[0] = opt->use_bf16_storage;
      local_f8[1] = opt->use_fp16_packed;
      local_f8[2] = opt->use_fp16_storage;
      local_f8[3] = opt->use_fp16_arithmetic;
      local_f8[4] = opt->use_int8_packed;
      local_f8[5] = opt->use_int8_storage;
      local_f8[6] = opt->use_int8_arithmetic;
      local_f8[7] = opt->use_packing_layout;
      local_f8[8] = opt->use_shader_pack8;
      local_f8[9] = opt->use_subgroup_basic;
      local_f8[10] = opt->use_subgroup_vote;
      local_f8[0xb] = opt->use_subgroup_ballot;
      local_f8[0xc] = opt->use_subgroup_shuffle;
      local_f8[0xd] = opt->use_image_storage;
      local_f8[0xe] = opt->use_tensor_storage;
      local_f8[0xf] = opt->use_weight_fp16_storage;
      local_e8._0_4_ = opt->flush_denormals;
      local_e8._4_1_ = opt->use_local_pool_allocator;
      local_e8._5_1_ = opt->use_reserved_1;
      local_e8._6_1_ = opt->use_reserved_2;
      local_e8._7_1_ = opt->use_reserved_3;
      iStack_e0._0_1_ = opt->use_reserved_4;
      iStack_e0._1_1_ = opt->use_reserved_5;
      iStack_e0._2_1_ = opt->use_reserved_6;
      iStack_e0._3_1_ = opt->use_reserved_7;
      unique0x100003df = opt->use_reserved_8;
      unique0x100003e0 = opt->use_reserved_9;
      unique0x100003e1 = opt->use_reserved_10;
      unique0x100003e2 = opt->use_reserved_11;
      local_118._8_8_ = opt->workspace_allocator;
      convert_packing(bottom_blob,&local_168,1,(Option *)local_118);
      iVar44 = InnerProduct::forward_int8
                         ((InnerProduct *)
                          ((long)&this->_vptr_InnerProduct_x86 +
                          (long)this->_vptr_InnerProduct_x86[-3]),&local_168,top_blob,opt);
      piVar18 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar18 == (int *)0x0) {
        return iVar44;
      }
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 != 0) {
        return iVar44;
      }
      if (local_168.allocator != (Allocator *)0x0) {
        (*(local_168.allocator)->_vptr_Allocator[3])();
        return iVar44;
      }
      goto LAB_001d428d;
    }
  }
  else {
    local_168.elempack = bottom_blob->elempack;
  }
  local_168.elemsize._0_4_ = (int)bottom_blob->elemsize;
  local_168.data = bottom_blob->data;
  piVar18 = bottom_blob->refcount;
  local_168.refcount._0_4_ = SUB84(piVar18,0);
  local_168.refcount._4_4_ = (undefined4)((ulong)piVar18 >> 0x20);
  local_168.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_168.allocator = bottom_blob->allocator;
  uVar17 = bottom_blob->h;
  uVar23 = bottom_blob->d;
  local_168.c = bottom_blob->c;
  local_168.cstep = bottom_blob->cstep;
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + 1;
    UNLOCK();
  }
  local_168.h = uVar17;
  local_168.d = uVar23;
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    local_118[0] = opt->lightmode;
    local_118._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_118._4_4_ = opt->num_threads;
    local_118._16_8_ = opt->workspace_allocator;
    local_118._24_4_ = opt->openmp_blocktime;
    local_118[0x1c] = opt->use_winograd_convolution;
    local_118[0x1d] = opt->use_sgemm_convolution;
    local_118[0x1e] = opt->use_int8_inference;
    local_118[0x1f] = opt->use_vulkan_compute;
    local_f8[0] = opt->use_bf16_storage;
    local_f8[1] = opt->use_fp16_packed;
    local_f8[2] = opt->use_fp16_storage;
    local_f8[3] = opt->use_fp16_arithmetic;
    local_f8[4] = opt->use_int8_packed;
    local_f8[5] = opt->use_int8_storage;
    local_f8[6] = opt->use_int8_arithmetic;
    local_f8[7] = opt->use_packing_layout;
    local_f8[8] = opt->use_shader_pack8;
    local_f8[9] = opt->use_subgroup_basic;
    local_f8[10] = opt->use_subgroup_vote;
    local_f8[0xb] = opt->use_subgroup_ballot;
    local_f8[0xc] = opt->use_subgroup_shuffle;
    local_f8[0xd] = opt->use_image_storage;
    local_f8[0xe] = opt->use_tensor_storage;
    local_f8[0xf] = opt->use_weight_fp16_storage;
    local_e8._0_4_ = opt->flush_denormals;
    local_e8._4_1_ = opt->use_local_pool_allocator;
    local_e8._5_1_ = opt->use_reserved_1;
    local_e8._6_1_ = opt->use_reserved_2;
    local_e8._7_1_ = opt->use_reserved_3;
    iStack_e0._0_1_ = opt->use_reserved_4;
    iStack_e0._1_1_ = opt->use_reserved_5;
    iStack_e0._2_1_ = opt->use_reserved_6;
    iStack_e0._3_1_ = opt->use_reserved_7;
    unique0x1000043f = opt->use_reserved_8;
    unique0x10000440 = opt->use_reserved_9;
    unique0x10000441 = opt->use_reserved_10;
    unique0x10000442 = opt->use_reserved_11;
    local_118._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,
                     (Mat *)(&this->field_0x208 + (long)this->_vptr_InnerProduct_x86[-3]),
                     (Option *)local_118);
  }
  local_118._8_8_ = CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  local_118._0_8_ = local_168.data;
  local_118._16_8_ = CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize);
  local_118._24_4_ = local_168.elempack;
  local_f8._12_4_ = local_168.w;
  local_f8._8_4_ = local_168.dims;
  local_e8._4_4_ = local_168.d;
  local_e8._0_4_ = local_168.h;
  local_f8._0_8_ = local_168.allocator;
  iStack_e0 = local_168.c;
  local_d8 = local_168.cstep;
  if ((Allocator *)local_118._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)&((Allocator *)local_118._8_8_)->_vptr_Allocator =
         *(int *)&((Allocator *)local_118._8_8_)->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (local_168.dims != 1) {
    local_c8.data = *(void **)opt;
    local_c8.elemsize = (size_t)opt->workspace_allocator;
    uVar24 = opt->openmp_blocktime;
    uVar25 = opt->use_winograd_convolution;
    uVar27 = opt->use_sgemm_convolution;
    uVar29 = opt->use_int8_inference;
    uVar31 = opt->use_vulkan_compute;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    auVar59[0] = opt->use_bf16_storage;
    auVar59[1] = opt->use_fp16_packed;
    auVar59[2] = opt->use_fp16_storage;
    auVar59[3] = opt->use_fp16_arithmetic;
    auVar59[4] = opt->use_int8_packed;
    auVar59[5] = opt->use_int8_storage;
    auVar59[6] = opt->use_int8_arithmetic;
    auVar59[7] = opt->use_packing_layout;
    uVar3 = opt->use_shader_pack8;
    uVar4 = opt->use_subgroup_basic;
    uVar6 = opt->use_subgroup_vote;
    uVar8 = opt->use_subgroup_ballot;
    uVar10 = opt->use_subgroup_shuffle;
    uVar12 = opt->use_image_storage;
    uVar14 = opt->use_tensor_storage;
    uVar16 = opt->use_weight_fp16_storage;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    uVar9 = CONCAT41(uVar11,uVar8);
    uVar7 = CONCAT51(uVar9,uVar6);
    uVar5 = CONCAT61(uVar7,uVar4);
    auVar59._8_8_ = CONCAT71(uVar5,uVar3);
    local_c8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    uVar32._0_1_ = opt->use_reserved_4;
    uVar32._1_1_ = opt->use_reserved_5;
    uVar32._2_1_ = opt->use_reserved_6;
    uVar32._3_1_ = opt->use_reserved_7;
    uVar33 = opt->use_reserved_8;
    uVar34 = opt->use_reserved_9;
    uVar36 = opt->use_reserved_10;
    uVar38 = opt->use_reserved_11;
    uVar37 = CONCAT11(uVar38,uVar36);
    uVar35 = CONCAT21(uVar37,uVar34);
    uVar32._4_4_ = CONCAT31(uVar35,uVar33);
    local_c8.c = (int)uVar32;
    local_c8.allocator = auVar59._0_8_;
    local_c8.dims = (int)auVar59._8_8_;
    local_c8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_c8.elempack = uVar24;
    local_c8._28_4_ = uVar26;
    local_c8.w = uVar11;
    local_c8._60_4_ = uVar32._4_4_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,&local_168,local_118);
  }
  bVar46 = (*(uint *)(this->_vptr_InnerProduct_x86[-3] + 0x28 + (long)&(this->weight_data_int8).data
                     ) & 7) == 0 & opt->use_packing_layout;
  iVar51 = 1;
  if (bVar46 != 0) {
    iVar51 = 8;
  }
  Mat::create(top_blob,(int)*(uint *)(this->_vptr_InnerProduct_x86[-3] + 0x28 +
                                     (long)&(this->weight_data_int8).data) / iVar51,
              (ulong)(uint)(iVar51 * 4),iVar51,opt->blob_allocator);
  iVar44 = -100;
  if ((top_blob->data != (void *)0x0) &&
     (local_120 = top_blob, (long)top_blob->c * top_blob->cstep != 0)) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,
                *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x28 +
                        (long)&(this->weight_data_int8).data) / iVar51,(ulong)(uint)(iVar51 * 4),
                iVar51,opt->workspace_allocator);
    iVar44 = -100;
    if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
      pp_Var19 = this->_vptr_InnerProduct_x86;
      p_Var48 = pp_Var19[-3];
      if (bVar46 == 0) {
        if (0 < *(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data)) {
          pvVar20 = (this->weight_data_int8).data;
          sVar21 = (this->weight_data_int8).elemsize;
          lVar45 = 0;
          lVar49 = 0;
          do {
            iVar51 = 0;
            if (0 < iVar47) {
              lVar50 = 0;
              iVar51 = 0;
              do {
                iVar51 = iVar51 + (int)*(char *)((long)pvVar20 +
                                                lVar50 + (this->weight_data_int8).w * lVar45) *
                                  (int)*(char *)(local_118._0_8_ + lVar50);
                lVar50 = lVar50 + 1;
              } while (iVar47 != (int)lVar50);
            }
            *(int *)((long)local_c8.data + lVar49 * 4) = iVar51;
            lVar49 = lVar49 + 1;
            p_Var48 = pp_Var19[-3];
            lVar45 = lVar45 + sVar21;
          } while (lVar49 < *(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data));
        }
      }
      else if (7 < *(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data)) {
        lVar45 = 0;
        do {
          iVar54 = 0;
          iVar55 = 0;
          iVar56 = 0;
          iVar57 = 0;
          iVar51 = 0;
          iVar44 = 0;
          iVar52 = 0;
          iVar53 = 0;
          if (0 < iVar47) {
            lVar49 = 0;
            do {
              auVar59 = pshuflw(ZEXT416((uint)(int)*(char *)(local_118._0_8_ + lVar49)),
                                ZEXT416((uint)(int)*(char *)(local_118._0_8_ + lVar49)),0);
              auVar60._0_4_ = auVar59._0_4_;
              auVar60._4_4_ = auVar60._0_4_;
              auVar60._8_4_ = auVar60._0_4_;
              auVar60._12_4_ = auVar60._0_4_;
              uVar2 = *(ulong *)((long)(this->weight_data_int8).data +
                                lVar49 * 8 +
                                (this->weight_data_int8).elemsize * lVar45 *
                                (long)(this->weight_data_int8).w);
              cVar69 = (char)(uVar2 >> 8);
              cVar70 = (char)(uVar2 >> 0x10);
              cVar71 = (char)(uVar2 >> 0x18);
              cVar72 = (char)(uVar2 >> 0x20);
              cVar73 = (char)(uVar2 >> 0x28);
              cVar74 = (char)(uVar2 >> 0x30);
              auVar68._8_6_ = 0;
              auVar68._0_8_ = uVar2;
              auVar68[0xe] = (char)(uVar2 >> 0x38);
              auVar68[0xf] = -((long)uVar2 < 0);
              auVar67._14_2_ = auVar68._14_2_;
              auVar67._8_5_ = 0;
              auVar67._0_8_ = uVar2;
              auVar67[0xd] = -(cVar74 < '\0');
              auVar66._13_3_ = auVar67._13_3_;
              auVar66._8_4_ = 0;
              auVar66._0_8_ = uVar2;
              auVar66[0xc] = cVar74;
              auVar65._12_4_ = auVar66._12_4_;
              auVar65._8_3_ = 0;
              auVar65._0_8_ = uVar2;
              auVar65[0xb] = -(cVar73 < '\0');
              auVar64._11_5_ = auVar65._11_5_;
              auVar64._8_2_ = 0;
              auVar64._0_8_ = uVar2;
              auVar64[10] = cVar73;
              auVar63._10_6_ = auVar64._10_6_;
              auVar63[8] = 0;
              auVar63._0_8_ = uVar2;
              auVar63[9] = -(cVar72 < '\0');
              auVar62._9_7_ = auVar63._9_7_;
              auVar62[8] = cVar72;
              auVar62._0_8_ = uVar2;
              Var41 = CONCAT91(CONCAT81(auVar62._8_8_,-(cVar71 < '\0')),cVar71);
              auVar40._2_10_ = Var41;
              auVar40[1] = -(cVar70 < '\0');
              auVar40[0] = cVar70;
              auVar39._2_12_ = auVar40;
              auVar39[1] = -(cVar69 < '\0');
              auVar39[0] = cVar69;
              auVar61._0_2_ = CONCAT11(-((char)uVar2 < '\0'),(char)uVar2);
              auVar61._2_14_ = auVar39;
              sVar75 = auVar59._0_2_;
              sVar79 = auVar59._2_2_;
              sVar80 = sVar79 * (short)Var41;
              auVar59 = pmulhw(auVar61,auVar60);
              iVar76 = CONCAT22(auVar59._6_2_,sVar80);
              Var41 = CONCAT64(CONCAT42(iVar76,auVar59._4_2_),
                               CONCAT22(sVar75 * auVar40._0_2_,sVar80));
              auVar42._4_8_ = (long)((unkuint10)Var41 >> 0x10);
              auVar42._2_2_ = auVar59._2_2_;
              auVar42._0_2_ = sVar79 * auVar39._0_2_;
              iVar51 = iVar51 + CONCAT22(auVar59._0_2_,sVar75 * auVar61._0_2_);
              iVar44 = iVar44 + auVar42._0_4_;
              iVar52 = iVar52 + (int)((unkuint10)Var41 >> 0x10);
              iVar53 = iVar53 + iVar76;
              iVar76 = CONCAT22(auVar59._8_2_,sVar75 * auVar62._8_2_);
              auVar77._0_8_ = CONCAT26(auVar59._10_2_,CONCAT24(sVar79 * auVar64._10_2_,iVar76));
              auVar77._8_2_ = sVar75 * auVar66._12_2_;
              auVar77._10_2_ = auVar59._12_2_;
              auVar78._12_2_ = sVar79 * auVar67._14_2_;
              auVar78._0_12_ = auVar77;
              auVar78._14_2_ = auVar59._14_2_;
              iVar54 = iVar54 + iVar76;
              iVar55 = iVar55 + (int)((ulong)auVar77._0_8_ >> 0x20);
              iVar56 = iVar56 + auVar77._8_4_;
              iVar57 = iVar57 + auVar78._12_4_;
              lVar49 = lVar49 + 1;
            } while (iVar47 != (int)lVar49);
          }
          piVar18 = (int *)((long)local_c8.data + lVar45 * 0x20);
          *piVar18 = iVar51;
          piVar18[1] = iVar44;
          piVar18[2] = iVar52;
          piVar18[3] = iVar53;
          piVar18 = (int *)((long)local_c8.data + lVar45 * 0x20 + 0x10);
          *piVar18 = iVar54;
          piVar18[1] = iVar55;
          piVar18[2] = iVar56;
          piVar18[3] = iVar57;
          lVar45 = lVar45 + 1;
          p_Var48 = pp_Var19[-3];
          iVar51 = *(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data);
          iVar44 = iVar51 + 7;
          if (-1 < iVar51) {
            iVar44 = iVar51;
          }
        } while (lVar45 < iVar44 >> 3);
      }
      local_38 = 0;
      local_78._0_8_ = (void *)0x0;
      local_78._8_4_ = 0;
      local_78._12_4_ = 0;
      local_78._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_58 = (Allocator *)0x0;
      iStack_50 = 0;
      iStack_4c = 0;
      auStack_48 = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)local_78,*(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data),4,
                  (Allocator *)0x0);
      pMVar43 = local_120;
      pp_Var19 = this->_vptr_InnerProduct_x86;
      p_Var48 = pp_Var19[-3];
      if (0 < *(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data)) {
        lVar45 = 0;
        do {
          fVar1 = *(float *)(*(long *)(&this->field_0x1c0 + (long)p_Var48) + lVar45 * 4);
          fVar58 = 0.0;
          if (fVar1 != 0.0) {
            fVar58 = 1.0 / (fVar1 * **(float **)(&this->field_0x208 + (long)p_Var48));
          }
          *(float *)(local_78._0_8_ + lVar45 * 4) = fVar58;
          lVar45 = lVar45 + 1;
          p_Var48 = pp_Var19[-3];
        } while (lVar45 < *(int *)(p_Var48 + 0x28 + (long)&(this->weight_data_int8).data));
      }
      dequantize_from_int32
                (&local_c8,local_120,(Mat *)local_78,(Mat *)(&this->field_0x178 + (long)p_Var48),opt
                );
      pLVar22 = this->activation;
      if (pLVar22 != (Layer *)0x0) {
        (*pLVar22->_vptr_Layer[9])(pLVar22,pMVar43,opt);
      }
      piVar18 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
      if (piVar18 != (int *)0x0) {
        LOCK();
        *piVar18 = *piVar18 + -1;
        UNLOCK();
        if (*piVar18 == 0) {
          if (local_58 == (Allocator *)0x0) {
            if ((void *)local_78._0_8_ != (void *)0x0) {
              free((void *)local_78._0_8_);
            }
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      iVar44 = 0;
    }
    piVar18 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((Allocator *)local_118._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_118._8_8_ = *(int *)(_func_int ***)local_118._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_118._8_8_ == 0) {
      if ((long *)local_f8._0_8_ == (long *)0x0) {
        if ((void *)local_118._0_8_ != (void *)0x0) {
          free((void *)local_118._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_f8._0_8_ + 0x18))();
      }
    }
  }
  piVar18 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar18 == (int *)0x0) {
    return iVar44;
  }
  LOCK();
  *piVar18 = *piVar18 + -1;
  UNLOCK();
  if (*piVar18 != 0) {
    return iVar44;
  }
  if (local_168.allocator != (Allocator *)0x0) {
    (*(local_168.allocator)->_vptr_Allocator[3])();
    return iVar44;
  }
LAB_001d428d:
  if (local_168.data != (void *)0x0) {
    free(local_168.data);
  }
  return iVar44;
}

Assistant:

int InnerProduct_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        Mat bottom_blob_unpacked;
        Option opt_unpack = opt;
        opt_unpack.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_unpack);

        return forward_int8(bottom_blob_unpacked, top_blob, opt);
    }

    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    Mat bottom_blob_int8_flattened = bottom_blob_int8;
    if (bottom_blob_int8.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;
        flatten->forward(bottom_blob_int8, bottom_blob_int8_flattened, opt_flatten);
    }

    //     int elempack = bottom_blob_int8_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__
    //     size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat top_blob_int32;
    top_blob_int32.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (out_elempack == 8)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                __m128i _val = _mm_set1_epi16((short)sptr[0]);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                __m128i _sl = _mm_mullo_epi16(_val, _w);
                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                _sum0 = _mm_add_epi32(_sum0, _s0);
                _sum1 = _mm_add_epi32(_sum1, _s1);

                sptr += 1;
                kptr += 8;
            }

            int* outptr = (int*)top_blob_int32;
            _mm_storeu_si128((__m128i*)(outptr + p * 8), _sum0);
            _mm_storeu_si128((__m128i*)(outptr + p * 8 + 4), _sum1);
        }
    }
#endif // __SSE2__

    if (out_elempack == 1)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            int sum = 0;

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                signed char val = sptr[0];

                signed char w = kptr[0];

                sum += val * w;

                sptr += 1;
                kptr += 1;
            }

            int* outptr = (int*)top_blob_int32;
            outptr[p] = sum;
        }
    }

    Mat scale_data(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_data[p] = scale_in;
    }

    dequantize_from_int32(top_blob_int32, top_blob, scale_data, bias_data, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}